

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetAccessIds
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MemoryObject *this)

{
  long lVar1;
  IRContext *this_00;
  ConstantManager *this_01;
  pointer pAVar2;
  pointer pAVar3;
  pointer puVar4;
  uint32_t id;
  Constant *this_02;
  long lVar5;
  allocator_type local_31;
  
  this_00 = this->variable_inst_->context_;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  this_01 = (this_00->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(this->access_chain_).
                   super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->access_chain_).
                   super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_31);
  pAVar2 = (this->access_chain_).
           super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->access_chain_).
           super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar2 != pAVar3) {
    puVar4 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      id = *(uint32_t *)((long)&pAVar2->field_1 + lVar5 * 2);
      if ((&pAVar2->is_result_id)[lVar5 * 2] == true) {
        this_02 = analysis::ConstantManager::FindDeclaredConstant(this_01,id);
        if (this_02 == (Constant *)0x0) {
          id = 0;
        }
        else {
          id = analysis::Constant::GetU32(this_02);
        }
      }
      lVar1 = lVar5 * 2;
      *(uint32_t *)((long)puVar4 + lVar5) = id;
      lVar5 = lVar5 + 4;
    } while ((pointer)(&pAVar2[1].is_result_id + lVar1) != pAVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> CopyPropagateArrays::MemoryObject::GetAccessIds() const {
  analysis::ConstantManager* const_mgr =
      variable_inst_->context()->get_constant_mgr();

  std::vector<uint32_t> indices(AccessChain().size());
  std::transform(AccessChain().cbegin(), AccessChain().cend(), indices.begin(),
                 [&const_mgr](const AccessChainEntry& entry) {
                   if (entry.is_result_id) {
                     const analysis::Constant* constant =
                         const_mgr->FindDeclaredConstant(entry.result_id);
                     return constant == nullptr ? 0 : constant->GetU32();
                   }

                   return entry.immediate;
                 });
  return indices;
}